

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::BinaryExpression::fromComponents
          (BinaryExpression *this,Expression *lhs,Expression *rhs,BinaryOperator op,
          SourceLocation opLoc,SourceRange sourceRange,ASTContext *context)

{
  SymbolKind SVar1;
  Compilation *compilation;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  BinaryExpression *expr;
  Compilation *pCVar5;
  Type *pTVar6;
  Diagnostic *diag;
  Diagnostic *diag_00;
  Type *pTVar7;
  Type *pTVar8;
  EntryPointer psVar9;
  logic_error *this_00;
  long *plVar10;
  uint uVar11;
  undefined4 in_register_0000000c;
  SourceLocation SVar12;
  long lVar13;
  char *pcVar14;
  size_type *psVar15;
  long *plVar16;
  Type *forceType;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  Compilation *compilation_00;
  BinaryOperator local_114;
  Type *local_110;
  SourceLocation local_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  SourceRange local_80;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  SVar12._4_4_ = in_register_0000000c;
  SVar12._0_4_ = op;
  local_114 = (BinaryOperator)rhs;
  local_80.startLoc = opLoc;
  local_80.endLoc = (SourceLocation)context;
  if (*(undefined8 **)sourceRange.startLoc == (undefined8 *)0x0) {
    pcVar14 = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
LAB_003c36af:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,pcVar14);
  }
  compilation_00 = (Compilation *)(this->super_Expression).type.ptr;
  if ((compilation_00 == (Compilation *)0x0) ||
     (pTVar6 = (lhs->type).ptr, local_108 = SVar12, pTVar6 == (Type *)0x0)) {
    pcVar14 = 
    "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
    goto LAB_003c36af;
  }
  compilation = (Compilation *)**(undefined8 **)sourceRange.startLoc;
  expr = BumpAllocator::
         emplace<slang::ast::BinaryExpression,slang::ast::BinaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                   ((BumpAllocator *)compilation,&local_114,(Type *)compilation_00,
                    &this->super_Expression,lhs,&local_80);
  bVar2 = Expression::bad(&this->super_Expression);
  if ((bVar2) || (bVar2 = Expression::bad(lhs), bVar2)) goto LAB_003c34b1;
  psVar9 = (compilation_00->options).topModules.
           super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           .entries;
  if (psVar9 == (EntryPointer)0x0) {
    Type::resolveCanonical((Type *)compilation_00);
    psVar9 = (compilation_00->options).topModules.
             super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             .entries;
  }
  if (*(int *)psVar9 == 0x1b) {
    compilation_00 = (Compilation *)compilation->intType;
  }
  pTVar8 = pTVar6->canonical;
  if (pTVar8 == (Type *)0x0) {
    Type::resolveCanonical(pTVar6);
    pTVar8 = pTVar6->canonical;
  }
  if ((pTVar8->super_Symbol).kind == UnboundedType) {
    pTVar6 = compilation->intType;
  }
  bVar2 = Type::isIntegral((Type *)compilation_00);
  if (bVar2) {
    bVar2 = Type::isIntegral(pTVar6);
  }
  else {
    bVar2 = false;
  }
  bVar3 = Type::isNumeric((Type *)compilation_00);
  if (bVar3) {
    bVar3 = Type::isNumeric(pTVar6);
  }
  else {
    bVar3 = false;
  }
  bVar4 = Expression::isImplicitString(&this->super_Expression);
  if (bVar4) {
    bVar4 = Expression::isImplicitString(lhs);
  }
  else {
    bVar4 = false;
  }
  pTVar8 = (Type *)(ulong)local_114;
  switch(pTVar8) {
  case (Type *)0x0:
  case (Type *)0x1:
  case (Type *)0x2:
    bVar2 = false;
    goto LAB_003c3441;
  case (Type *)0x3:
    bVar2 = true;
LAB_003c3441:
    pTVar8 = Expression::binaryOperatorType(compilation,(Type *)compilation_00,pTVar6,bVar2,false);
    if (pTVar8 == (Type *)0x0) {
LAB_003c36b9:
      pcVar14 = 
      "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
      ;
LAB_003c36ce:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,pcVar14);
    }
    (expr->super_Expression).type.ptr = pTVar8;
    break;
  case (Type *)0x4:
    bVar3 = true;
    goto LAB_003c3416;
  case (Type *)0x5:
  case (Type *)0x6:
  case (Type *)0x7:
  case (Type *)0x8:
    bVar3 = false;
LAB_003c3416:
    pTVar8 = Expression::binaryOperatorType(compilation,(Type *)compilation_00,pTVar6,bVar3,false);
    if (pTVar8 != (Type *)0x0) {
      (expr->super_Expression).type.ptr = pTVar8;
      bVar3 = bVar2;
      break;
    }
    goto LAB_003c36b9;
  case (Type *)0x9:
  case (Type *)0xa:
  case (Type *)0xb:
  case (Type *)0xc:
  case (Type *)0x11:
  case (Type *)0x12:
    if (bVar3 != false) {
      if (local_114 - Equality < 2) {
        bVar2 = Type::isFourState((Type *)compilation_00);
        lVar13 = 0x100;
        if (!bVar2) {
          bVar2 = Type::isFourState(pTVar6);
          lVar13 = (ulong)bVar2 * 8 + 0xf8;
        }
        pTVar8 = *(Type **)((long)&(compilation->super_BumpAllocator).head + lVar13);
      }
      else {
        if (1 < local_114 - CaseEquality) {
          bVar3 = Type::isFourState((Type *)compilation_00);
          if (compilation->scalarTypeTable[(ulong)bVar3 + 8] != (Type *)0x0) {
            (expr->super_Expression).type.ptr = compilation->scalarTypeTable[(ulong)bVar3 + 8];
            pTVar8 = Expression::binaryOperatorType
                               (compilation,(Type *)compilation_00,pTVar6,false,false);
            goto LAB_003c3142;
          }
          goto LAB_003c36b9;
        }
        pTVar8 = compilation->bitType;
      }
      if (pTVar8 != (Type *)0x0) {
        (expr->super_Expression).type.ptr = pTVar8;
        pTVar6 = Expression::binaryOperatorType
                           (compilation,(Type *)compilation_00,pTVar6,false,false);
        Expression::contextDetermined
                  ((ASTContext *)sourceRange.startLoc,&expr->left_,pTVar6,(SourceLocation)0x0);
        Expression::contextDetermined
                  ((ASTContext *)sourceRange.startLoc,&expr->right_,pTVar6,(SourceLocation)0x0);
        return &expr->super_Expression;
      }
      goto LAB_003c36b9;
    }
    local_110 = pTVar8;
    if (bVar4 == false) {
      bVar2 = Type::isAggregate((Type *)compilation_00);
      if ((bVar2) && (bVar2 = Type::isEquivalent((Type *)compilation_00,pTVar6), bVar2)) {
        psVar9 = (compilation_00->options).topModules.
                 super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 .entries;
        if (psVar9 == (EntryPointer)0x0) {
          Type::resolveCanonical((Type *)compilation_00);
          psVar9 = (compilation_00->options).topModules.
                   super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   .entries;
        }
        if (*(int *)psVar9 == 0x13) goto LAB_003c3218;
        bVar2 = Type::isFourState((Type *)compilation_00);
        lVar13 = 0x100;
        if (!bVar2) {
          bVar2 = Type::isFourState(pTVar6);
          lVar13 = (ulong)bVar2 * 8 + 0xf8;
        }
        pTVar8 = *(Type **)((long)&(compilation->super_BumpAllocator).head + lVar13);
LAB_003c35f0:
        if (pTVar8 == (Type *)0x0) goto LAB_003c36b9;
        (expr->super_Expression).type.ptr = pTVar8;
        Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->left_);
        Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->right_);
        goto LAB_003c30f3;
      }
LAB_003c3218:
      psVar9 = (compilation_00->options).topModules.
               super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               .entries;
      if (psVar9 == (EntryPointer)0x0) {
        Type::resolveCanonical((Type *)compilation_00);
        psVar9 = (compilation_00->options).topModules.
                 super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 .entries;
      }
      if ((*(int *)psVar9 == 0x14) &&
         (bVar2 = Type::isAssignmentCompatible((Type *)compilation_00,pTVar6), bVar2)) {
LAB_003c33d3:
        if (compilation->bitType != (Type *)0x0) {
          (expr->super_Expression).type.ptr = compilation->bitType;
          Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->left_);
          Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->right_);
          return &expr->super_Expression;
        }
        goto LAB_003c36b9;
      }
      pTVar8 = pTVar6->canonical;
      if (pTVar8 == (Type *)0x0) {
        Type::resolveCanonical(pTVar6);
        pTVar8 = pTVar6->canonical;
      }
      if (((pTVar8->super_Symbol).kind == ClassType) &&
         (bVar2 = Type::isAssignmentCompatible(pTVar6,(Type *)compilation_00), bVar2))
      goto LAB_003c33d3;
      psVar9 = (compilation_00->options).topModules.
               super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               .entries;
      if (psVar9 == (EntryPointer)0x0) {
        Type::resolveCanonical((Type *)compilation_00);
        psVar9 = (compilation_00->options).topModules.
                 super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 .entries;
      }
      uVar11 = *(uint *)psVar9;
      if (uVar11 - 0x17 < 2) {
        pTVar8 = pTVar6->canonical;
        if (pTVar8 == (Type *)0x0) {
          Type::resolveCanonical(pTVar6);
          pTVar8 = pTVar6->canonical;
        }
        if ((pTVar8->super_Symbol).kind - NullType < 2) goto LAB_003c33d3;
        psVar9 = (compilation_00->options).topModules.
                 super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 .entries;
        if (psVar9 == (EntryPointer)0x0) {
          Type::resolveCanonical((Type *)compilation_00);
          psVar9 = (compilation_00->options).topModules.
                   super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   .entries;
        }
        uVar11 = *(uint *)psVar9;
      }
      if ((uVar11 == 0x1a) || (uVar11 == 0x17)) {
        pTVar8 = pTVar6->canonical;
        if (pTVar8 == (Type *)0x0) {
          Type::resolveCanonical(pTVar6);
          pTVar8 = pTVar6->canonical;
        }
        SVar1 = (pTVar8->super_Symbol).kind;
        if ((SVar1 == EventType) || (SVar1 == NullType)) goto LAB_003c33d3;
        psVar9 = (compilation_00->options).topModules.
                 super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 .entries;
        if (psVar9 == (EntryPointer)0x0) {
          Type::resolveCanonical((Type *)compilation_00);
          psVar9 = (compilation_00->options).topModules.
                   super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   .entries;
        }
      }
      uVar11 = *(uint *)psVar9;
      if ((uVar11 | 2) == 0x17) {
        pTVar8 = pTVar6->canonical;
        if (pTVar8 == (Type *)0x0) {
          Type::resolveCanonical(pTVar6);
          pTVar8 = pTVar6->canonical;
        }
        if (((pTVar8->super_Symbol).kind | CompilationUnit) == NullType) goto LAB_003c33d3;
        psVar9 = (compilation_00->options).topModules.
                 super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 .entries;
        if (psVar9 == (EntryPointer)0x0) {
          Type::resolveCanonical((Type *)compilation_00);
          psVar9 = (compilation_00->options).topModules.
                   super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   .entries;
        }
        uVar11 = *(uint *)psVar9;
      }
      if ((uVar11 == 0x20) &&
         (bVar2 = Type::isAssignmentCompatible((Type *)compilation_00,pTVar6), bVar2))
      goto LAB_003c33d3;
      pTVar8 = pTVar6->canonical;
      if (pTVar8 == (Type *)0x0) {
        Type::resolveCanonical(pTVar6);
        pTVar8 = pTVar6->canonical;
      }
      if (((pTVar8->super_Symbol).kind == VirtualInterfaceType) &&
         (bVar2 = Type::isAssignmentCompatible(pTVar6,(Type *)compilation_00), bVar2))
      goto LAB_003c33d3;
      psVar9 = (compilation_00->options).topModules.
               super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               .entries;
      if (psVar9 == (EntryPointer)0x0) {
        Type::resolveCanonical((Type *)compilation_00);
        psVar9 = (compilation_00->options).topModules.
                 super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 .entries;
      }
      if (*(int *)psVar9 == 0x1c) {
        pTVar8 = pTVar6->canonical;
        if (pTVar8 == (Type *)0x0) {
          Type::resolveCanonical(pTVar6);
          pTVar8 = pTVar6->canonical;
        }
        if ((pTVar8->super_Symbol).kind == TypeRefType) {
          pTVar8 = compilation->bitType;
          goto LAB_003c35f0;
        }
      }
      Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->left_);
      Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->right_);
    }
    else {
      if (compilation->bitType == (Type *)0x0) goto LAB_003c36b9;
      (expr->super_Expression).type.ptr = compilation->bitType;
      Expression::contextDetermined
                ((ASTContext *)sourceRange.startLoc,&expr->left_,compilation->stringType,
                 (SourceLocation)0x0);
      Expression::contextDetermined
                ((ASTContext *)sourceRange.startLoc,&expr->right_,compilation->stringType,
                 (SourceLocation)0x0);
LAB_003c30f3:
      if ((uint)local_110 < 0x11) {
        return &expr->super_Expression;
      }
    }
    goto LAB_003c3465;
  case (Type *)0xd:
  case (Type *)0xe:
  case (Type *)0xf:
  case (Type *)0x10:
    bVar2 = Type::isFourState((Type *)compilation_00);
    lVar13 = 0x100;
    if (!bVar2) {
      bVar2 = Type::isFourState(pTVar6);
      lVar13 = (ulong)bVar2 * 8 + 0xf8;
    }
    pTVar8 = *(Type **)((long)&(compilation->super_BumpAllocator).head + lVar13);
    if (pTVar8 == (Type *)0x0) goto LAB_003c36b9;
    bVar2 = (bool)(bVar3 | bVar4);
    (expr->super_Expression).type.ptr = pTVar8;
    if (bVar4 == true && bVar3 == false) {
      pTVar8 = compilation->stringType;
    }
    else {
      pTVar8 = Expression::binaryOperatorType(compilation,(Type *)compilation_00,pTVar6,false,false)
      ;
    }
LAB_003c3142:
    Expression::contextDetermined
              ((ASTContext *)sourceRange.startLoc,&expr->left_,pTVar8,(SourceLocation)0x0);
    Expression::contextDetermined
              ((ASTContext *)sourceRange.startLoc,&expr->right_,pTVar8,(SourceLocation)0x0);
    bVar3 = bVar2;
    break;
  case (Type *)0x13:
  case (Type *)0x14:
  case (Type *)0x15:
  case (Type *)0x16:
    bVar2 = Type::isFourState((Type *)compilation_00);
    lVar13 = 0x100;
    if (!bVar2) {
      bVar2 = Type::isFourState(pTVar6);
      lVar13 = (ulong)bVar2 * 8 + 0xf8;
    }
    pTVar8 = *(Type **)((long)&(compilation->super_BumpAllocator).head + lVar13);
    if (pTVar8 == (Type *)0x0) goto LAB_003c36b9;
    (expr->super_Expression).type.ptr = pTVar8;
    Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->left_);
LAB_003c2fbd:
    Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->right_);
    break;
  case (Type *)0x17:
  case (Type *)0x18:
  case (Type *)0x19:
  case (Type *)0x1a:
    bVar3 = Type::isFourState(pTVar6);
    if (bVar3) {
      pCVar5 = (Compilation *)
               fromComponents::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)compilation,compilation_00,forceType);
      if (pCVar5 == (Compilation *)0x0) goto LAB_003c36b9;
    }
    else {
      pCVar5 = compilation_00;
      if (compilation_00 == (Compilation *)0x0) {
        pcVar14 = 
        "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *&]"
        ;
        goto LAB_003c36ce;
      }
    }
    (expr->super_Expression).type.ptr = (Type *)pCVar5;
    Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->right_);
    bVar3 = bVar2;
    break;
  case (Type *)0x1b:
    psVar9 = (compilation_00->options).topModules.
             super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             .entries;
    if (psVar9 == (EntryPointer)0x0) {
      Type::resolveCanonical((Type *)compilation_00);
      psVar9 = (compilation_00->options).topModules.
               super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               .entries;
      pTVar8 = extraout_RDX;
    }
    if (*(int *)psVar9 != 8) {
      pTVar7 = pTVar6->canonical;
      if (pTVar7 == (Type *)0x0) {
        Type::resolveCanonical(pTVar6);
        pTVar7 = pTVar6->canonical;
        pTVar8 = extraout_RDX_00;
      }
      if ((pTVar7->super_Symbol).kind != FloatingType) {
        pTVar8 = fromComponents::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)compilation,compilation_00,pTVar8);
        if (pTVar8 != (Type *)0x0) {
          (expr->super_Expression).type.ptr = pTVar8;
          goto LAB_003c2fbd;
        }
        goto LAB_003c36b9;
      }
    }
    pTVar8 = Expression::binaryOperatorType(compilation,(Type *)compilation_00,pTVar6,false,false);
    if (pTVar8 == (Type *)0x0) goto LAB_003c36b9;
    (expr->super_Expression).type.ptr = pTVar8;
    Expression::contextDetermined
              ((ASTContext *)sourceRange.startLoc,&expr->right_,pTVar8,(SourceLocation)0x0);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
               ,"");
    plVar10 = (long *)std::__cxx11::string::append((char *)local_e0);
    local_c0._M_dataplus._M_p = (pointer)*plVar10;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_c0._M_dataplus._M_p == psVar15) {
      local_c0.field_2._M_allocated_capacity = *psVar15;
      local_c0.field_2._8_8_ = plVar10[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar15;
    }
    local_c0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x322);
    std::operator+(&local_50,&local_c0,&local_70);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_a0 = (long *)*plVar10;
    plVar16 = plVar10 + 2;
    if (local_a0 == plVar16) {
      local_90 = *plVar16;
      lStack_88 = plVar10[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar16;
    }
    local_98 = plVar10[1];
    *plVar10 = (long)plVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_a0);
    local_100 = (long *)*plVar10;
    plVar16 = plVar10 + 2;
    if (local_100 == plVar16) {
      local_f0 = *plVar16;
      lStack_e8 = plVar10[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *plVar16;
    }
    local_f8 = plVar10[1];
    *plVar10 = (long)plVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_100);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (bVar3 == false) {
LAB_003c3465:
    diag = ASTContext::addDiag((ASTContext *)sourceRange.startLoc,(DiagCode)0x1d0007,local_108);
    diag_00 = ast::operator<<(diag,(Type *)compilation_00);
    ast::operator<<(diag_00,pTVar6);
    Diagnostic::operator<<(diag,(this->super_Expression).sourceRange);
    Diagnostic::operator<<(diag,lhs->sourceRange);
LAB_003c34b1:
    expr = (BinaryExpression *)Expression::badExpr(compilation,&expr->super_Expression);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& BinaryExpression::fromComponents(Expression& lhs, Expression& rhs, BinaryOperator op,
                                             SourceLocation opLoc, SourceRange sourceRange,
                                             const ASTContext& context) {
    auto& compilation = context.getCompilation();
    const Type* lt = lhs.type;
    const Type* rt = rhs.type;

    auto result = compilation.emplace<BinaryExpression>(op, *lt, lhs, rhs, sourceRange);
    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lt->isUnbounded())
        lt = &compilation.getIntType();
    if (rt->isUnbounded())
        rt = &compilation.getIntType();

    bool bothIntegral = lt->isIntegral() && rt->isIntegral();
    bool bothNumeric = lt->isNumeric() && rt->isNumeric();
    bool bothStrings = lhs.isImplicitString() && rhs.isImplicitString();

    auto forceFourState = [](Compilation& compilation, const Type* forceType) {
        if (forceType->isFloating() || forceType->isFourState())
            return forceType;

        // Use the logic in binaryOperatorType to create a type with the correct size and sign.
        return binaryOperatorType(compilation, forceType, forceType, true);
    };

    auto singleBitType = [](Compilation& compilation, const Type* lt, const Type* rt) {
        if (lt->isFourState() || rt->isFourState())
            return &compilation.getLogicType();
        return &compilation.getBitType();
    };

    bool good;
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
            good = bothNumeric;
            result->type = binaryOperatorType(compilation, lt, rt, false);
            break;
        case BinaryOperator::Divide:
            // Result is forced to 4-state because result can be X.
            good = bothNumeric;
            result->type = binaryOperatorType(compilation, lt, rt, true);
            break;
        case BinaryOperator::Mod:
            // Result is forced to 4-state because result can be X.
            // Different from divide because only integers are allowed.
            good = bothIntegral;
            result->type = binaryOperatorType(compilation, lt, rt, true);
            break;
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            good = bothIntegral;
            result->type = binaryOperatorType(compilation, lt, rt, false);
            break;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
            // The result is always the same type as the lhs, except that if the rhs is
            // four state then the lhs also becomes four state.
            good = bothIntegral;
            if (rt->isFourState())
                result->type = forceFourState(compilation, lt);
            else
                result->type = lt;
            selfDetermined(context, result->right_);
            break;
        case BinaryOperator::Power:
            good = bothNumeric;
            if (lt->isFloating() || rt->isFloating()) {
                result->type = binaryOperatorType(compilation, lt, rt, false);
                contextDetermined(context, result->right_, *result->type);
            }
            else {
                // Result is forced to 4-state because result can be X.
                result->type = forceFourState(compilation, lt);
                selfDetermined(context, result->right_);
            }
            break;
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan: {
            // Result is always a single bit.
            good = bothNumeric || bothStrings;
            result->type = singleBitType(compilation, lt, rt);

            // Result type is fixed but the two operands affect each other as they would in
            // other context-determined operators.
            auto nt = (good && !bothNumeric) ? &compilation.getStringType()
                                             : binaryOperatorType(compilation, lt, rt, false);
            contextDetermined(context, result->left_, *nt);
            contextDetermined(context, result->right_, *nt);
            break;
        }
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            // Result is always a single bit.
            good = bothNumeric;
            result->type = singleBitType(compilation, lt, rt);
            selfDetermined(context, result->left_);
            selfDetermined(context, result->right_);
            break;
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
            // Two types are comparable if:
            // - they are both integral or floating
            // - both classes or null, and assignment compatible
            // - both chandles or null
            // - both aggregates and equivalent
            if (bothNumeric) {
                // For equality and inequality, result is four state if either operand is
                // four state. For case equality and case inequality, result is never four
                // state. For wildcard equality / inequality, result is four state only if
                // lhs is four state.
                if (op == BinaryOperator::Equality || op == BinaryOperator::Inequality) {
                    good = true;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if (op == BinaryOperator::CaseEquality ||
                         op == BinaryOperator::CaseInequality) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = bothIntegral;
                    result->type = lt->isFourState() ? &compilation.getLogicType()
                                                     : &compilation.getBitType();
                }

                // Result type is fixed but the two operands affect each other as they would
                // in other context-determined operators.
                auto nt = binaryOperatorType(compilation, lt, rt, false);
                contextDetermined(context, result->left_, *nt);
                contextDetermined(context, result->right_, *nt);
            }
            else {
                bool isContext = false;
                bool isWildcard = op == BinaryOperator::WildcardEquality ||
                                  op == BinaryOperator::WildcardInequality;

                if (bothStrings) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();

                    // If there is a literal involved, make sure it's converted to string.
                    isContext = true;
                    contextDetermined(context, result->left_, compilation.getStringType());
                    contextDetermined(context, result->right_, compilation.getStringType());
                }
                else if (lt->isAggregate() && lt->isEquivalent(*rt) && !lt->isUnpackedUnion()) {
                    good = !isWildcard;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if ((lt->isClass() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isClass() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCHandle() || lt->isNull()) && (rt->isCHandle() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isEvent() || lt->isNull()) && (rt->isEvent() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCovergroup() || lt->isNull()) &&
                         (rt->isCovergroup() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isVirtualInterface() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isVirtualInterface() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if (lt->isTypeRefType() && rt->isTypeRefType()) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = false;
                }

                if (!isContext) {
                    selfDetermined(context, result->left_);
                    selfDetermined(context, result->right_);
                }
            }
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadBinaryExpression, opLoc);
        diag << *lt << *rt;
        diag << lhs.sourceRange;
        diag << rhs.sourceRange;
        return badExpr(compilation, result);
    }

    return *result;
}